

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyDynamicVariable::operator==(BerdyDynamicVariable *this,BerdyDynamicVariable *v)

{
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  undefined1 local_11;
  
  local_11 = false;
  if (*in_RSI == *(int *)in_RDI) {
    local_11 = std::operator==(unaff_retaddr,in_RDI);
  }
  return local_11;
}

Assistant:

bool BerdyDynamicVariable::operator==(const struct BerdyDynamicVariable &v) const
{
    return v.type == this->type
    && v.id == this->id;
}